

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O3

ostream * Kandinsky::operator<<(ostream *stream,Expression *expression)

{
  char *local_30;
  long local_28;
  char local_20 [16];
  
  (*expression->_vptr_Expression[2])(&local_30,expression,0);
  std::__ostream_insert<char,std::char_traits<char>>(stream,local_30,local_28);
  if (local_30 != local_20) {
    operator_delete(local_30);
  }
  return stream;
}

Assistant:

std::ostream& operator<< (std::ostream& stream, const Expression& expression) {
        stream << expression.toString();
        return stream;
    }